

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowLevelIoExamples.cpp
# Opt level: O2

void writeRgbaFILE(FILE *cfile,char *fileName,Rgba *pixels,int width,int height)

{
  int iVar1;
  RgbaOutputFile file;
  undefined8 local_88;
  C_OStream ostr;
  Header local_50 [56];
  
  C_OStream::C_OStream(&ostr,cfile,fileName);
  local_88 = 0;
  Imf_3_4::Header::Header((Header *)0x3f800000,0x3f800000,local_50,width,height,&local_88,0,3);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaOutputFile::RgbaOutputFile(&file,&ostr.super_OStream,local_50,WRITE_RGBA,iVar1);
  Imf_3_4::Header::~Header(local_50);
  Imf_3_4::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels,1);
  Imf_3_4::RgbaOutputFile::writePixels((int)&file);
  Imf_3_4::RgbaOutputFile::~RgbaOutputFile(&file);
  Imf_3_4::OStream::~OStream(&ostr.super_OStream);
  return;
}

Assistant:

void
writeRgbaFILE (
    FILE*       cfile,
    const char  fileName[],
    const Rgba* pixels,
    int         width,
    int         height)
{
    //
    // Store an RGBA image in a C stdio file that has already been opened:
    //
    //	- create a C_OStream object for writing to the file
    //	- create an RgbaOutputFile object, and attach it to the C_OStream
    //	- describe the memory layout of the pixels
    //	- store the pixels in the file
    //

    C_OStream      ostr (cfile, fileName);
    RgbaOutputFile file (ostr, Header (width, height), WRITE_RGBA);
    file.setFrameBuffer (pixels, 1, width);
    file.writePixels (height);
}